

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlHashQLookup3(void)

{
  int iVar1;
  int iVar2;
  xmlHashTablePtr val;
  xmlChar *val_00;
  xmlChar *val_01;
  xmlChar *val_02;
  xmlChar *val_03;
  xmlChar *val_04;
  xmlChar *val_05;
  void *val_06;
  int local_84;
  int n_name3;
  xmlChar *name3;
  int n_prefix3;
  xmlChar *prefix3;
  int n_name2;
  xmlChar *name2;
  int n_prefix2;
  xmlChar *prefix2;
  int n_name;
  xmlChar *name;
  int n_prefix;
  xmlChar *prefix;
  int n_hash;
  xmlHashTablePtr hash;
  void *ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (prefix._4_4_ = 0; (int)prefix._4_4_ < 2; prefix._4_4_ = prefix._4_4_ + 1) {
    for (name._4_4_ = 0; (int)name._4_4_ < 5; name._4_4_ = name._4_4_ + 1) {
      for (prefix2._4_4_ = 0; (int)prefix2._4_4_ < 5; prefix2._4_4_ = prefix2._4_4_ + 1) {
        for (name2._4_4_ = 0; (int)name2._4_4_ < 5; name2._4_4_ = name2._4_4_ + 1) {
          for (prefix3._4_4_ = 0; (int)prefix3._4_4_ < 5; prefix3._4_4_ = prefix3._4_4_ + 1) {
            for (name3._4_4_ = 0; (int)name3._4_4_ < 5; name3._4_4_ = name3._4_4_ + 1) {
              for (local_84 = 0; local_84 < 5; local_84 = local_84 + 1) {
                iVar1 = xmlMemBlocks();
                val = gen_xmlHashTablePtr(prefix._4_4_,0);
                val_00 = gen_const_xmlChar_ptr(name._4_4_,1);
                val_01 = gen_const_xmlChar_ptr(prefix2._4_4_,2);
                val_02 = gen_const_xmlChar_ptr(name2._4_4_,3);
                val_03 = gen_const_xmlChar_ptr(prefix3._4_4_,4);
                val_04 = gen_const_xmlChar_ptr(name3._4_4_,5);
                val_05 = gen_const_xmlChar_ptr(local_84,6);
                val_06 = (void *)xmlHashQLookup3(val,val_00,val_01,val_02,val_03,val_04,val_05);
                desret_void_ptr(val_06);
                call_tests = call_tests + 1;
                des_xmlHashTablePtr(prefix._4_4_,val,0);
                des_const_xmlChar_ptr(name._4_4_,val_00,1);
                des_const_xmlChar_ptr(prefix2._4_4_,val_01,2);
                des_const_xmlChar_ptr(name2._4_4_,val_02,3);
                des_const_xmlChar_ptr(prefix3._4_4_,val_03,4);
                des_const_xmlChar_ptr(name3._4_4_,val_04,5);
                des_const_xmlChar_ptr(local_84,val_05,6);
                xmlResetLastError();
                iVar2 = xmlMemBlocks();
                if (iVar1 != iVar2) {
                  iVar2 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlHashQLookup3",(ulong)(uint)(iVar2 - iVar1));
                  ret_val._4_4_ = ret_val._4_4_ + 1;
                  printf(" %d",(ulong)prefix._4_4_);
                  printf(" %d",(ulong)name._4_4_);
                  printf(" %d",(ulong)prefix2._4_4_);
                  printf(" %d",(ulong)name2._4_4_);
                  printf(" %d",(ulong)prefix3._4_4_);
                  printf(" %d",(ulong)name3._4_4_);
                  printf(" %d");
                  printf("\n");
                }
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlHashQLookup3(void) {
    int test_ret = 0;

    int mem_base;
    void * ret_val;
    xmlHashTablePtr hash; /* hash table */
    int n_hash;
    const xmlChar * prefix; /* first prefix */
    int n_prefix;
    const xmlChar * name; /* first local name */
    int n_name;
    const xmlChar * prefix2; /* second prefix */
    int n_prefix2;
    const xmlChar * name2; /* second local name */
    int n_name2;
    const xmlChar * prefix3; /* third prefix */
    int n_prefix3;
    const xmlChar * name3; /* third local name */
    int n_name3;

    for (n_hash = 0;n_hash < gen_nb_xmlHashTablePtr;n_hash++) {
    for (n_prefix = 0;n_prefix < gen_nb_const_xmlChar_ptr;n_prefix++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_prefix2 = 0;n_prefix2 < gen_nb_const_xmlChar_ptr;n_prefix2++) {
    for (n_name2 = 0;n_name2 < gen_nb_const_xmlChar_ptr;n_name2++) {
    for (n_prefix3 = 0;n_prefix3 < gen_nb_const_xmlChar_ptr;n_prefix3++) {
    for (n_name3 = 0;n_name3 < gen_nb_const_xmlChar_ptr;n_name3++) {
        mem_base = xmlMemBlocks();
        hash = gen_xmlHashTablePtr(n_hash, 0);
        prefix = gen_const_xmlChar_ptr(n_prefix, 1);
        name = gen_const_xmlChar_ptr(n_name, 2);
        prefix2 = gen_const_xmlChar_ptr(n_prefix2, 3);
        name2 = gen_const_xmlChar_ptr(n_name2, 4);
        prefix3 = gen_const_xmlChar_ptr(n_prefix3, 5);
        name3 = gen_const_xmlChar_ptr(n_name3, 6);

        ret_val = xmlHashQLookup3(hash, prefix, name, prefix2, name2, prefix3, name3);
        desret_void_ptr(ret_val);
        call_tests++;
        des_xmlHashTablePtr(n_hash, hash, 0);
        des_const_xmlChar_ptr(n_prefix, prefix, 1);
        des_const_xmlChar_ptr(n_name, name, 2);
        des_const_xmlChar_ptr(n_prefix2, prefix2, 3);
        des_const_xmlChar_ptr(n_name2, name2, 4);
        des_const_xmlChar_ptr(n_prefix3, prefix3, 5);
        des_const_xmlChar_ptr(n_name3, name3, 6);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlHashQLookup3",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_hash);
            printf(" %d", n_prefix);
            printf(" %d", n_name);
            printf(" %d", n_prefix2);
            printf(" %d", n_name2);
            printf(" %d", n_prefix3);
            printf(" %d", n_name3);
            printf("\n");
        }
    }
    }
    }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}